

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# engrave.c
# Opt level: O2

void wipeout_text(char *engr,int cnt,uint seed)

{
  char cVar1;
  int x;
  int iVar2;
  uint uVar3;
  size_t sVar4;
  void *pvVar5;
  long lVar6;
  size_t sVar7;
  char cVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  char *__s;
  bool bVar12;
  
  uVar11 = (ulong)seed;
  sVar4 = strlen(engr);
  x = (int)sVar4;
  if (0 < cnt && x != 0) {
    while (bVar12 = cnt != 0, cnt = cnt + -1, bVar12) {
      if ((int)uVar11 == 0) {
        iVar2 = rn2(x);
        uVar11 = 0;
        uVar3 = mt_random();
        uVar10 = (ulong)uVar3;
      }
      else {
        iVar2 = (int)(uVar11 % (sVar4 & 0xffffffff));
        uVar10 = (ulong)(uint)((int)uVar11 * 0x1f) % 0xff;
        uVar11 = uVar10;
      }
      cVar1 = engr[iVar2];
      if (cVar1 != 0x20) {
        pvVar5 = memchr("?.,\'`-|_",(int)cVar1,9);
        cVar8 = ' ';
        if ((pvVar5 == (void *)0x0) && (cVar8 = '?', (uVar10 & 3) != 0)) {
          lVar9 = -8;
          do {
            lVar6 = lVar9;
            if (lVar6 + 0x10 == 0x2b8) goto LAB_00193364;
            lVar9 = lVar6 + 0x10;
          } while (cVar1 != *(char *)((long)&rubouts[0].wipeto + lVar6));
          if ((int)uVar11 == 0) {
            __s = *(char **)(&rubouts[1].wipefrom + lVar6);
            sVar7 = strlen(__s);
            uVar3 = rn2((int)sVar7);
            uVar10 = (ulong)uVar3;
            uVar11 = 0;
          }
          else {
            uVar11 = (ulong)(uint)((int)uVar11 * 0x1f) % 0xff;
            __s = *(char **)(&rubouts[1].wipefrom + lVar6);
            sVar7 = strlen(__s);
            uVar10 = uVar11 % sVar7;
          }
          cVar8 = __s[uVar10 & 0xffffffff];
        }
LAB_00193364:
        engr[iVar2] = cVar8;
      }
    }
  }
  lVar9 = (long)x;
  while ((lVar9 != 0 && (engr[lVar9 + -1] == ' '))) {
    engr[lVar9 + -1] = '\0';
    lVar9 = lVar9 + -1;
  }
  return;
}

Assistant:

void wipeout_text(char *engr,
		  int cnt,
		  unsigned seed) /* for semi-controlled randomization */
{
	char *s;
	int i, j, nxt, use_rubout, lth = (int)strlen(engr);

	if (lth && cnt > 0) {
	    while (cnt--) {
		/* pick next character */
		if (!seed) {
		    /* random */
		    nxt = rn2(lth);
		    use_rubout = rn2(4);
		} else {
		    /* predictable; caller can reproduce the same sequence by
		       supplying the same arguments later, or a pseudo-random
		       sequence by varying any of them */
		    nxt = seed % lth;
		    seed *= 31,  seed %= (BUFSZ-1);
		    use_rubout = seed & 3;
		}
		s = &engr[nxt];
		if (*s == ' ') continue;

		/* rub out unreadable & small punctuation marks */
		if (strchr("?.,'`-|_", *s)) {
		    *s = ' ';
		    continue;
		}

		if (!use_rubout)
		    i = SIZE(rubouts);
		else
		    for (i = 0; i < SIZE(rubouts); i++)
			if (*s == rubouts[i].wipefrom) {
			    /*
			     * Pick one of the substitutes at random.
			     */
			    if (!seed)
				j = rn2(strlen(rubouts[i].wipeto));
			    else {
				seed *= 31,  seed %= (BUFSZ-1);
				j = seed % (strlen(rubouts[i].wipeto));
			    }
			    *s = rubouts[i].wipeto[j];
			    break;
			}

		/* didn't pick rubout; use '?' for unreadable character */
		if (i == SIZE(rubouts)) *s = '?';
	    }
	}

	/* trim trailing spaces */
	while (lth && engr[lth-1] == ' ') engr[--lth] = 0;
}